

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall
VertexAttrib64Bit::LimitTest::prepareVertexArrayBuffer(LimitTest *this,_iteration iteration)

{
  pointer *this_00;
  glBufferDataFunc p_Var1;
  GLenum err;
  reference pvVar2;
  uint local_70;
  GLuint vertex;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> buffer_data;
  attributeConfiguration configuration;
  GLuint buffer_length;
  _iteration iteration_local;
  LimitTest *this_local;
  
  this_00 = &buffer_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  attributeConfiguration::attributeConfiguration((attributeConfiguration *)this_00);
  getVertexArrayConfiguration(this,iteration,(attributeConfiguration *)this_00);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)local_60,
             (ulong)(uint)((int)configuration.m_type_names << 10));
  for (local_70 = 0; local_70 < 0x400; local_70 = local_70 + 1) {
    setAttributes(this,iteration,
                  (attributeConfiguration *)
                  &buffer_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,local_70,
                  (vector<double,_std::allocator<double>_> *)local_60);
  }
  p_Var1 = (this->super_Base).gl.bufferData;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,0);
  (*p_Var1)(0x8892,(ulong)(uint)((int)configuration.m_type_names << 10) << 3,pvVar2,0x88e4);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x939);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  return;
}

Assistant:

void LimitTest::prepareVertexArrayBuffer(_iteration iteration)
{
	GLuint				   buffer_length = 0;
	attributeConfiguration configuration;

	getVertexArrayConfiguration(iteration, configuration);

	buffer_length = m_n_vertices * configuration.m_vertex_length;

	std::vector<GLdouble> buffer_data;
	buffer_data.resize(buffer_length);

	for (GLuint vertex = 0; vertex < m_n_vertices; ++vertex)
	{
		setAttributes(iteration, configuration, vertex, buffer_data);
	}

	gl.bufferData(GL_ARRAY_BUFFER, buffer_length * sizeof(GLdouble), &buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");
}